

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkDistance.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkDistance::IntLoadConstraint_C
          (ChLinkDistance *this,uint off_L,ChVectorDynamic<> *Qc,double c,bool do_clamp,
          double recovery_clamp)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  ulong uVar5;
  double *pdVar6;
  undefined1 auVar7 [16];
  double dVar8;
  undefined1 auVar9 [16];
  undefined8 in_XMM1_Qb;
  undefined1 auVar11 [16];
  undefined1 auVar10 [16];
  
  iVar4 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])();
  if ((char)iVar4 != '\0') {
    lVar1 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    uVar5 = (ulong)off_L;
    if (do_clamp) {
      if (lVar1 <= (long)uVar5) {
LAB_0057d20c:
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      auVar3._8_8_ = in_XMM1_Qb;
      auVar3._0_8_ = recovery_clamp;
      pdVar6 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      auVar2._8_8_ = 0x8000000000000000;
      auVar2._0_8_ = 0x8000000000000000;
      auVar7 = vxorpd_avx512vl(auVar3,auVar2);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = (this->curr_dist - this->distance) * c;
      auVar7 = vmaxsd_avx(auVar9,auVar7);
      auVar7 = vminsd_avx(auVar7,auVar3);
      dVar8 = auVar7._0_8_ + pdVar6[uVar5];
    }
    else {
      if (lVar1 <= (long)uVar5) goto LAB_0057d20c;
      pdVar6 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = c;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = pdVar6[uVar5];
      auVar10._8_8_ = 0;
      auVar10._0_8_ = this->curr_dist - this->distance;
      auVar7 = vfmadd213sd_fma(auVar10,auVar11,auVar7);
      dVar8 = auVar7._0_8_;
    }
    pdVar6[uVar5] = dVar8;
  }
  return;
}

Assistant:

void ChLinkDistance::IntLoadConstraint_C(const unsigned int off_L,  ///< offset in Qc residual
                                         ChVectorDynamic<>& Qc,     ///< result: the Qc residual, Qc += c*C
                                         const double c,            ///< a scaling factor
                                         bool do_clamp,             ///< apply clamping to c*C?
                                         double recovery_clamp      ///< value for min/max clamping of c*C
                                         ) {
    if (!IsActive())
        return;

    if (do_clamp)
        Qc(off_L) += ChMin(ChMax(c * (curr_dist - distance), -recovery_clamp), recovery_clamp);
    else
        Qc(off_L) += c * (curr_dist - distance);
}